

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_string(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *this,string_t *result,bool get_char)

{
  bool bVar1;
  byte bVar2;
  allocator<char> *__a;
  byte in_DL;
  char *in_RDI;
  string message;
  string last_token;
  uint64_t len_7;
  uint32_t len_6;
  uint16_t len_5;
  int64_t len_4;
  int32_t len_3;
  int16_t len_2;
  int8_t len_1;
  uint8_t len;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe80;
  long *plVar3;
  string_t *in_stack_fffffffffffffe88;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe90;
  undefined8 uVar4;
  undefined4 in_stack_fffffffffffffe98;
  input_format_t in_stack_fffffffffffffe9c;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffea0;
  input_format_t format;
  undefined1 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffea9;
  undefined1 in_stack_fffffffffffffeaa;
  undefined1 in_stack_fffffffffffffeab;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  input_format_t in_stack_fffffffffffffee4;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffee8;
  undefined1 local_f8 [40];
  string local_d0 [48];
  string local_a0 [32];
  string local_80 [16];
  void *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  input_format_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  bool local_1;
  
  if ((in_DL & 1) != 0) {
    get(in_stack_fffffffffffffe80);
  }
  bVar1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa4,(char *)in_stack_ffffffffffffff98);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return false;
  }
  __a = (allocator<char> *)(ulong)(*(int *)(in_RDI + 0x10) - 0x49);
  format = (input_format_t)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  switch(__a) {
  case (allocator<char> *)0x0:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<short,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,
                                            CONCAT15(in_stack_fffffffffffffead,
                                                     CONCAT14(in_stack_fffffffffffffeac,
                                                              CONCAT13(in_stack_fffffffffffffeab,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                       (short *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_1 = false;
    if (bVar1) {
      local_1 = get_string<short>(in_stack_fffffffffffffe90,
                                  (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                                  (short)((ulong)in_stack_fffffffffffffe88 >> 0x10),
                                  (string_t *)in_stack_fffffffffffffe80);
    }
    break;
  default:
    goto LAB_00276b21;
  case (allocator<char> *)0x3:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<long,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,
                                            CONCAT15(in_stack_fffffffffffffead,
                                                     CONCAT14(in_stack_fffffffffffffeac,
                                                              CONCAT13(in_stack_fffffffffffffeab,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                       (long *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_1 = false;
    if (bVar1) {
      local_1 = get_string<long>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                                 (long)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    break;
  case (allocator<char> *)0x4:
    if (*(int *)(in_RDI + 0x24) == 5) {
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_long,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,
                                              CONCAT15(in_stack_fffffffffffffead,
                                                       CONCAT14(in_stack_fffffffffffffeac,
                                                                CONCAT13(in_stack_fffffffffffffeab,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                         (unsigned_long *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (!bVar1) {
        return false;
      }
      bVar1 = get_string<unsigned_long>
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (unsigned_long)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      return bVar1;
    }
    goto LAB_00276b21;
  case (allocator<char> *)0xc:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,
                                            CONCAT15(in_stack_fffffffffffffead,
                                                     CONCAT14(in_stack_fffffffffffffeac,
                                                              CONCAT13(in_stack_fffffffffffffeab,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                       (uchar *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_1 = false;
    if (bVar1) {
      local_1 = get_string<unsigned_char>
                          (in_stack_fffffffffffffe90,
                           (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           (uchar)((ulong)in_stack_fffffffffffffe88 >> 0x18),
                           (string_t *)in_stack_fffffffffffffe80);
    }
    break;
  case (allocator<char> *)0x20:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,
                                            CONCAT15(in_stack_fffffffffffffead,
                                                     CONCAT14(in_stack_fffffffffffffeac,
                                                              CONCAT13(in_stack_fffffffffffffeab,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                       (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_1 = false;
    if (bVar1) {
      local_1 = get_string<signed_char>
                          (in_stack_fffffffffffffe90,
                           (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           (char)((ulong)in_stack_fffffffffffffe88 >> 0x18),
                           (string_t *)in_stack_fffffffffffffe80);
    }
    break;
  case (allocator<char> *)0x23:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<int,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,
                                            CONCAT15(in_stack_fffffffffffffead,
                                                     CONCAT14(in_stack_fffffffffffffeac,
                                                              CONCAT13(in_stack_fffffffffffffeab,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                       (int *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_1 = false;
    if (bVar1) {
      local_1 = get_string<int>(in_stack_fffffffffffffe90,
                                (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                                (int)in_stack_fffffffffffffe88,(string_t *)in_stack_fffffffffffffe80
                               );
    }
    break;
  case (allocator<char> *)0x24:
    if (*(int *)(in_RDI + 0x24) == 5) {
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_int,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,
                                              CONCAT15(in_stack_fffffffffffffead,
                                                       CONCAT14(in_stack_fffffffffffffeac,
                                                                CONCAT13(in_stack_fffffffffffffeab,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                         (uint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (!bVar1) {
        return false;
      }
      bVar1 = get_string<unsigned_int>
                        (in_stack_fffffffffffffe90,
                         (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                         (uint)in_stack_fffffffffffffe88,(string_t *)in_stack_fffffffffffffe80);
      return bVar1;
    }
    goto LAB_00276b21;
  case (allocator<char> *)0x2c:
    if (*(int *)(in_RDI + 0x24) == 5) {
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_short,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,
                                              CONCAT15(in_stack_fffffffffffffead,
                                                       CONCAT14(in_stack_fffffffffffffeac,
                                                                CONCAT13(in_stack_fffffffffffffeab,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))),format,
                         (unsigned_short *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (!bVar1) {
        return false;
      }
      bVar1 = get_string<unsigned_short>
                        (in_stack_fffffffffffffe90,
                         (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                         (unsigned_short)((ulong)in_stack_fffffffffffffe88 >> 0x10),
                         (string_t *)in_stack_fffffffffffffe80);
      return bVar1;
    }
LAB_00276b21:
    get_token_string(in_stack_fffffffffffffec8);
    std::__cxx11::string::string(local_80);
    if (*(int *)(in_RDI + 0x24) == 5) {
      std::operator+((char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::__cxx11::string::operator=(local_80,local_d0);
      std::__cxx11::string::~string(local_d0);
    }
    else {
      std::operator+((char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::__cxx11::string::operator=(local_80,local_a0);
      std::__cxx11::string::~string(local_a0);
    }
    plVar3 = *(long **)(in_RDI + 0x28);
    uVar4 = *(undefined8 *)(in_RDI + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffec0,in_RDI,__a);
    exception_message(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                      in_stack_fffffffffffffed0);
    parse_error::create<std::nullptr_t,_0>
              (in_stack_ffffffffffffffac,
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar2 = (**(code **)(*plVar3 + 0x60))(plVar3,uVar4,&stack0xffffffffffffffa0,local_f8);
    local_1 = (bool)(bVar2 & 1);
    parse_error::~parse_error((parse_error *)0x276cb8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  return local_1;
}

Assistant:

bool get_ubjson_string(string_t& result, const bool get_char = true)
    {
        if (get_char)
        {
            get();  // TODO(niels): may we ignore N here?
        }

        if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format, "value")))
        {
            return false;
        }

        switch (current)
        {
            case 'U':
            {
                std::uint8_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'i':
            {
                std::int8_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'I':
            {
                std::int16_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'l':
            {
                std::int32_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'L':
            {
                std::int64_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'u':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint16_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'm':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint32_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            case 'M':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint64_t len{};
                return get_number(input_format, len) && get_string(input_format, len, result);
            }

            default:
                break;
        }
        auto last_token = get_token_string();
        std::string message;

        if (input_format != input_format_t::bjdata)
        {
            message = "expected length type specification (U, i, I, l, L); last byte: 0x" + last_token;
        }
        else
        {
            message = "expected length type specification (U, i, u, I, m, l, M, L); last byte: 0x" + last_token;
        }
        return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format, message, "string"), nullptr));
    }